

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O0

void testSharedFrameBuffer(string *tempDir)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  void *pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint uVar6;
  exception *e;
  int comp;
  int numThreads;
  int n;
  Array2D<Imf_3_2::Rgba> p1;
  int H;
  int W;
  Compression in_stack_00000168;
  RgbaChannels in_stack_0000016c;
  Array2D<Imf_3_2::Rgba> *in_stack_00000170;
  int in_stack_00000178;
  int in_stack_0000017c;
  char *in_stack_00000180;
  Array2D<Imf_3_2::Rgba> *in_stack_fffffffffffffee0;
  undefined4 in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff20;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffff30;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [36];
  int local_44;
  int local_40;
  int local_3c;
  undefined4 local_1c;
  undefined4 local_18;
  
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "Testing reading from and writing to files using\nmultiple threads and a shared framebuffer"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = IlmThread_3_2::supportsThreads();
  if ((bVar2 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"   Threading not supported!");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_18 = 0x55b;
    local_1c = 0x9f;
    Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
              (in_stack_ffffffffffffff30,(long)poVar4,CONCAT17(bVar2,in_stack_ffffffffffffff20));
    anon_unknown.dwarf_20b0ad::fillPixels
              (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
               (int)in_stack_ffffffffffffff08);
    for (local_3c = 0; local_3c < 9; local_3c = local_3c + 1) {
      uVar1 = local_3c * 3;
      uVar6 = uVar1;
      if ((int)uVar1 < 0) {
        uVar6 = local_3c * 3 + 7;
      }
      local_40 = uVar1 - (uVar6 & 0xfffffff8);
      Imf_3_2::setGlobalThreadCount(local_40);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::operator<<((ostream *)&std::cout,"number of threads: ");
      iVar3 = Imf_3_2::globalThreadCount();
      pvVar5 = (void *)std::ostream::operator<<(__lhs,iVar3);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      for (local_44 = 0; local_44 < 10; local_44 = local_44 + 1) {
        std::operator+(__lhs,(char *)CONCAT44(iVar3,in_stack_ffffffffffffff00));
        std::__cxx11::string::c_str();
        anon_unknown.dwarf_20b0ad::writeReadRGBA
                  (in_stack_00000180,in_stack_0000017c,in_stack_00000178,in_stack_00000170,
                   in_stack_0000016c,in_stack_00000168);
        std::__cxx11::string::~string(local_68);
        std::operator+(__lhs,(char *)CONCAT44(iVar3,in_stack_ffffffffffffff00));
        std::__cxx11::string::c_str();
        anon_unknown.dwarf_20b0ad::writeReadRGBA
                  (in_stack_00000180,in_stack_0000017c,in_stack_00000178,in_stack_00000170,
                   in_stack_0000016c,in_stack_00000168);
        std::__cxx11::string::~string(local_88);
        std::operator+(__lhs,(char *)CONCAT44(iVar3,in_stack_ffffffffffffff00));
        std::__cxx11::string::c_str();
        anon_unknown.dwarf_20b0ad::writeReadRGBA
                  (in_stack_00000180,in_stack_0000017c,in_stack_00000178,in_stack_00000170,
                   in_stack_0000016c,in_stack_00000168);
        std::__cxx11::string::~string(local_a8);
        std::operator+(__lhs,(char *)CONCAT44(iVar3,in_stack_ffffffffffffff00));
        std::__cxx11::string::c_str();
        anon_unknown.dwarf_20b0ad::writeReadRGBA
                  (in_stack_00000180,in_stack_0000017c,in_stack_00000178,in_stack_00000170,
                   in_stack_0000016c,in_stack_00000168);
        std::__cxx11::string::~string(local_c8);
      }
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"ok\n");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(in_stack_fffffffffffffee0);
  }
  return;
}

Assistant:

void
testSharedFrameBuffer (const std::string& tempDir)
{
    try
    {
        cout << "Testing reading from and writing to files using\n"
                "multiple threads and a shared framebuffer"
             << endl;

        if (!ILMTHREAD_NAMESPACE::supportsThreads ())
        {
            cout << "   Threading not supported!" << endl << endl;
            return;
        }

#if ILMTHREAD_THREADING_ENABLED
        const int W = 1371;
        const int H = 159;

        Array2D<Rgba> p1 (H, W);
        fillPixels (p1, W, H);

        for (int n = 0; n <= 8; n++)
        {
            int numThreads = (n * 3) % 8;

            setGlobalThreadCount (numThreads);
            cout << "number of threads: " << globalThreadCount () << endl;

            for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
            {
                writeReadRGBA (
                    (tempDir + "imf_test_rgba.exr").c_str (),
                    W,
                    H,
                    p1,
                    WRITE_RGBA,
                    Compression (comp));

                writeReadRGBA (
                    (tempDir + "imf_test_rgba.exr").c_str (),
                    W,
                    H,
                    p1,
                    WRITE_RGB,
                    Compression (comp));

                writeReadRGBA (
                    (tempDir + "imf_test_rgba.exr").c_str (),
                    W,
                    H,
                    p1,
                    WRITE_A,
                    Compression (comp));

                writeReadRGBA (
                    (tempDir + "imf_test_rgba.exr").c_str (),
                    W,
                    H,
                    p1,
                    RgbaChannels (WRITE_R | WRITE_B),
                    Compression (comp));
            }
        }
#endif
        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}